

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.h
# Opt level: O2

void __thiscall jrtplib::RTCPSDESInfo::SDESPrivateItem::~SDESPrivateItem(SDESPrivateItem *this)

{
  RTPMemoryManager *in_RDX;
  
  (this->super_SDESItem).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__SDESPrivateItem_00145a60;
  if ((jrtplib *)this->prefix != (jrtplib *)0x0) {
    RTPDeleteByteArray((jrtplib *)this->prefix,
                       (uint8_t *)(this->super_SDESItem).super_RTPMemoryObject.mgr,in_RDX);
  }
  SDESItem::~SDESItem(&this->super_SDESItem);
  return;
}

Assistant:

~SDESPrivateItem()						
		{ 
			if (prefix) 
				RTPDeleteByteArray(prefix,GetMemoryManager());
		}